

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O2

bool __thiscall OpenMD::RigidBody::getAtomVel(RigidBody *this,Vector3d *vel,uint index)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  Vector3d ref;
  Vector3d velRot;
  Vector3d ji;
  Mat3x3d I;
  Mat3x3d skewMat;
  Vector<double,_3U> local_1f8;
  Vector<double,_3U> local_1e0;
  undefined1 local_1c8 [16];
  double local_1b8;
  Vector<double,_3U> local_1b0;
  SquareMatrix3<double> local_198;
  RectMatrix<double,_3U,_3U> local_150;
  RotMat3x3d local_108;
  double local_c0 [4];
  undefined8 local_a0;
  double local_80;
  undefined1 local_78 [24];
  double local_60;
  double local_58;
  undefined1 local_50 [16];
  double local_40;
  double local_38;
  
  uVar4 = (ulong)index;
  uVar3 = (long)(this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3;
  if (uVar4 < uVar3) {
    Vector<double,_3U>::Vector(&local_1e0);
    SquareMatrix<double,_3>::SquareMatrix((SquareMatrix<double,_3> *)local_78);
    Vector<double,_3U>::Vector
              (&local_1f8,
               &(this->refCoords_).
                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar4].super_Vector<double,_3U>);
    StuntDouble::getJ((Vector3d *)local_1c8,&this->super_StuntDouble);
    (*(this->super_StuntDouble)._vptr_StuntDouble[5])(local_c0,this);
    local_78._0_8_ = 0.0;
    local_60 = -local_1b8 / local_80;
    local_58 = 0.0;
    auVar5._8_8_ = local_1c8._8_8_ ^ 0x8000000000000000;
    auVar5._0_8_ = local_1b8;
    auVar1._8_8_ = local_a0;
    auVar1._0_8_ = local_80;
    local_78._8_16_ = divpd(auVar5,auVar1);
    local_40 = -local_1c8._0_8_ / local_c0[0];
    auVar2._8_8_ = local_a0;
    auVar2._0_8_ = local_c0[0];
    local_50 = divpd(local_1c8,auVar2);
    local_38 = 0.0;
    StuntDouble::getA(&local_108,&this->super_StuntDouble);
    operator*(&local_198,&local_108,(SquareMatrix3<double> *)local_78);
    SquareMatrix3<double>::transpose((SquareMatrix3<double> *)&local_150,&local_198);
    operator*(&local_1b0,&local_150,&local_1f8);
    Vector3<double>::operator=((Vector3<double> *)&local_1e0,&local_1b0);
    StuntDouble::getVel((Vector3d *)&local_198,&this->super_StuntDouble);
    operator+((Vector<double,_3U> *)&local_150,(Vector<double,_3U> *)&local_198,&local_1e0);
    Vector3<double>::operator=(vel,(Vector<double,_3U> *)&local_150);
  }
  else {
    snprintf(painCave.errMsg,2000,
             "Index %d is an invalid index, the current rigid body contains %zu atoms.\n",
             (ulong)index,uVar3);
    painCave.isFatal = 0;
    simError();
  }
  return uVar4 < uVar3;
}

Assistant:

bool RigidBody::getAtomVel(Vector3d& vel, unsigned int index) {
    // velRot = $(A\cdot skew(I^{-1}j))^{T}refCoor$

    if (index < atoms_.size()) {
      Vector3d velRot;
      Mat3x3d skewMat;
      ;
      Vector3d ref = refCoords_[index];
      Vector3d ji  = getJ();
      Mat3x3d I    = getI();

      skewMat(0, 0) = 0;
      skewMat(0, 1) = ji[2] / I(2, 2);
      skewMat(0, 2) = -ji[1] / I(1, 1);

      skewMat(1, 0) = -ji[2] / I(2, 2);
      skewMat(1, 1) = 0;
      skewMat(1, 2) = ji[0] / I(0, 0);

      skewMat(2, 0) = ji[1] / I(1, 1);
      skewMat(2, 1) = -ji[0] / I(0, 0);
      skewMat(2, 2) = 0;

      velRot = (getA() * skewMat).transpose() * ref;

      vel = getVel() + velRot;
      return true;

    } else {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "Index %d is an invalid index, the current rigid body contains %zu "
          "atoms.\n",
          index, atoms_.size());
      painCave.isFatal = 0;
      simError();
      return false;
    }
  }